

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O1

uint32_t decCheckMath(decNumber *rhs,decContext *set,uint32_t *status)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  
  uVar1 = *status;
  uVar3 = 0x40;
  if ((((999999 < set->digits) || (uVar3 = 0x40, 999999 < set->emax)) || (set->emin < -999999)) ||
     (((iVar2 = rhs->digits, 999999 < iVar2 || ((rhs->exponent + iVar2) - 0xf4241U < 0xffd23943)) &&
      ((uVar3 = 0x80, iVar2 != 1 || ((rhs->lsu[0] != '\0' || ((rhs->bits & 0x70) != 0)))))))) {
    *status = uVar3 | uVar1;
  }
  return (uint)(*status != uVar1);
}

Assistant:

static uInt decCheckMath(const decNumber *rhs, decContext *set,
                         uInt *status) {
  uInt save=*status;                         /* record  */
  if (set->digits>DEC_MAX_MATH
   || set->emax>DEC_MAX_MATH
   || -set->emin>DEC_MAX_MATH) *status|=DEC_Invalid_context;
   else if ((rhs->digits>DEC_MAX_MATH
     || rhs->exponent+rhs->digits>DEC_MAX_MATH+1
     || rhs->exponent+rhs->digits<2*(1-DEC_MAX_MATH))
     && !ISZERO(rhs)) *status|=DEC_Invalid_operation;
  return (*status!=save);
  }